

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void ggml::cpu::aarch64::gemv<block_iq4_nl,4l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  int in_stack_0000003c;
  undefined4 in_stack_00000044;
  void *in_stack_00000048;
  size_t in_stack_00000050;
  float *in_stack_00000058;
  int in_stack_00000064;
  int in_stack_00000070;
  
  ggml_gemv_iq4_nl_4x4_q8_0
            (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
             (void *)CONCAT44(in_stack_00000044,nc),in_stack_0000003c,in_stack_00000070);
  return;
}

Assistant:

void gemv<block_iq4_nl, 4, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_iq4_nl_4x4_q8_0(n, s, bs, vx, vy, nr, nc);
}